

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

int __thiscall
xercesc_4_0::TraverseSchema::parseBlockSet
          (TraverseSchema *this,DOMElement *elem,int blockType,bool isRoot)

{
  bool bVar1;
  XMLCh *str1;
  XMLCh *local_90;
  XMLCh *token;
  undefined1 local_68 [8];
  XMLStringTokenizer tokenizer;
  int blockSet;
  XMLCh *blockVal;
  bool isRoot_local;
  int blockType_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  if (isRoot) {
    local_90 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_BLOCKDEFAULT,UnKnown);
  }
  else {
    local_90 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_BLOCK,UnKnown);
  }
  if (local_90 == (XMLCh *)0x0) {
    this_local._4_4_ = SchemaInfo::getBlockDefault(this->fSchemaInfo);
  }
  else {
    tokenizer.fMemoryManager._4_4_ = 0;
    bVar1 = XMLString::equals(local_90,(XMLCh *)SchemaSymbols::fgATTVAL_POUNDALL);
    if (bVar1) {
      this_local._4_4_ = 7;
    }
    else {
      XMLStringTokenizer::XMLStringTokenizer
                ((XMLStringTokenizer *)local_68,local_90,this->fGrammarPoolMemoryManager);
      while (bVar1 = XMLStringTokenizer::hasMoreTokens((XMLStringTokenizer *)local_68), bVar1) {
        str1 = XMLStringTokenizer::nextToken((XMLStringTokenizer *)local_68);
        bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATTVAL_SUBSTITUTION);
        if ((bVar1) && (blockType == 0)) {
          if ((tokenizer.fMemoryManager._4_4_ & 1) == 0) {
            tokenizer.fMemoryManager._4_4_ = tokenizer.fMemoryManager._4_4_ + 1;
          }
        }
        else {
          bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATTVAL_EXTENSION);
          if (bVar1) {
            if ((tokenizer.fMemoryManager._4_4_ & 2) == 0) {
              tokenizer.fMemoryManager._4_4_ = tokenizer.fMemoryManager._4_4_ + 2;
            }
          }
          else {
            bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATTVAL_RESTRICTION);
            if (bVar1) {
              if ((tokenizer.fMemoryManager._4_4_ & 4) == 0) {
                tokenizer.fMemoryManager._4_4_ = tokenizer.fMemoryManager._4_4_ + 4;
              }
            }
            else {
              reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x3f,local_90,(XMLCh *)0x0
                                ,(XMLCh *)0x0,(XMLCh *)0x0);
            }
          }
        }
      }
      this_local._4_4_ = tokenizer.fMemoryManager._4_4_;
      XMLStringTokenizer::~XMLStringTokenizer((XMLStringTokenizer *)local_68);
    }
  }
  return this_local._4_4_;
}

Assistant:

int TraverseSchema::parseBlockSet(const DOMElement* const elem,
                                  const int blockType, const bool isRoot) {

    const XMLCh* blockVal = (isRoot) ? getElementAttValue(elem, SchemaSymbols::fgATT_BLOCKDEFAULT)
                                     : getElementAttValue(elem, SchemaSymbols::fgATT_BLOCK);

    // blockVal == 0 means 'block attribute is missing'; *blockVal == 0 means 'block="" found'
    if (blockVal == 0)
        return fSchemaInfo->getBlockDefault();

    int blockSet = 0;

    if (XMLString::equals(blockVal, SchemaSymbols::fgATTVAL_POUNDALL)) {

        blockSet = SchemaSymbols::XSD_EXTENSION + SchemaSymbols::XSD_RESTRICTION + SchemaSymbols::XSD_SUBSTITUTION;
        return blockSet;
    }

    XMLStringTokenizer tokenizer(blockVal, fGrammarPoolMemoryManager);

    while (tokenizer.hasMoreTokens()) {

        XMLCh* token = tokenizer.nextToken();

        if (XMLString::equals(token, SchemaSymbols::fgATTVAL_SUBSTITUTION)
            && blockType == ES_Block) {

            if ((blockSet & SchemaSymbols::XSD_SUBSTITUTION) == 0 ) {
                blockSet += SchemaSymbols::XSD_SUBSTITUTION;
            }
        }
        else if (XMLString::equals(token, SchemaSymbols::fgATTVAL_EXTENSION)) {

            if ((blockSet & SchemaSymbols::XSD_EXTENSION) == 0) {
                blockSet += SchemaSymbols::XSD_EXTENSION;
            }
        }
        else if (XMLString::equals(token, SchemaSymbols::fgATTVAL_RESTRICTION)) {

            if ((blockSet & SchemaSymbols::XSD_RESTRICTION) == 0 ) {
                blockSet += SchemaSymbols::XSD_RESTRICTION;
            }
        }
        else {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidBlockValue, blockVal);
        }
    } //end while

    return blockSet;
}